

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Sequence.cpp
# Opt level: O3

void __thiscall
chrono::ChFseqNode::ChFseqNode(ChFseqNode *this,shared_ptr<chrono::ChFunction> *myfx,double mdur)

{
  (this->fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (myfx->super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(myfx->super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
            );
  this->duration = mdur;
  this->weight = 1.0;
  this->t_start = 0.0;
  this->t_end = mdur + 0.0;
  this->Iy = 0.0;
  this->Iydt = 0.0;
  *(undefined8 *)((long)&this->Iydt + 3) = 0;
  *(undefined8 *)((long)&this->Iydtdt + 3) = 0;
  return;
}

Assistant:

ChFseqNode::ChFseqNode(std::shared_ptr<ChFunction> myfx, double mdur) {
    fx = myfx;
    duration = mdur;
    weight = 1;
    t_start = 0;
    t_end = t_start + duration;
    Iy = Iydt = Iydtdt = 0.0;
    y_cont = ydt_cont = ydtdt_cont = false;
}